

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O1

bool __thiscall leveldb::log::Reader::ReadRecord(Reader *this,Slice *record,string *scratch)

{
  size_t sVar1;
  bool bVar2;
  size_t __len2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  size_type sVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  long in_FS_OFFSET;
  Slice fragment;
  char buf [40];
  Slice local_78;
  char local_68 [48];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->initial_offset_ <= this->last_record_offset_) ||
     (bVar3 = SkipToInitialBlock(this), bVar3)) {
    bVar2 = false;
    scratch->_M_string_length = 0;
    *(scratch->_M_dataplus)._M_p = '\0';
    record->data_ = "";
    record->size_ = 0;
    local_78.data_ = "";
    local_78.size_ = 0;
    uVar9 = 0;
    bVar3 = false;
    do {
      uVar4 = ReadPhysicalRecord(this,&local_78);
      __len2 = local_78.size_;
      sVar1 = (this->buffer_).size_;
      if (this->resyncing_ == true) {
        bVar6 = false;
        if (uVar4 != 3) {
          if (uVar4 != 4) {
            this->resyncing_ = false;
            goto LAB_00d39e95;
          }
          this->resyncing_ = false;
        }
      }
      else {
LAB_00d39e95:
        if (uVar4 - 1 < 6) {
          uVar8 = (this->end_of_buffer_offset_ - (sVar1 + local_78.size_)) - 7;
          switch(uVar4) {
          case 1:
            if ((bVar2) && (scratch->_M_string_length != 0)) {
              ReportCorruption(this,scratch->_M_string_length,"partial record without end(1)");
            }
            scratch->_M_string_length = 0;
            *(scratch->_M_dataplus)._M_p = '\0';
            record->data_ = local_78.data_;
            record->size_ = local_78.size_;
            this->last_record_offset_ = uVar8;
            bVar6 = true;
            bVar3 = true;
            uVar9 = uVar8;
            break;
          case 2:
            if ((bVar2) && (scratch->_M_string_length != 0)) {
              ReportCorruption(this,scratch->_M_string_length,"partial record without end(2)");
            }
            bVar6 = false;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(scratch,0,scratch->_M_string_length,local_78.data_,__len2);
            bVar2 = true;
            uVar9 = uVar8;
            break;
          case 3:
            if (bVar2) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(scratch,local_78.data_,local_78.size_);
            }
            else {
              pcVar5 = "missing start of fragmented record(1)";
LAB_00d3a039:
              ReportCorruption(this,local_78.size_,pcVar5);
            }
            bVar6 = false;
            break;
          case 4:
            if (!bVar2) {
              pcVar5 = "missing start of fragmented record(2)";
              goto LAB_00d3a039;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (scratch,local_78.data_,local_78.size_);
            sVar7 = scratch->_M_string_length;
            record->data_ = (scratch->_M_dataplus)._M_p;
            record->size_ = sVar7;
            this->last_record_offset_ = uVar9;
            bVar6 = true;
            bVar3 = true;
            break;
          case 5:
            bVar6 = true;
            if (bVar2) {
              scratch->_M_string_length = 0;
              *(scratch->_M_dataplus)._M_p = '\0';
            }
            bVar3 = false;
            break;
          case 6:
            bVar6 = false;
            if (bVar2) {
              sVar7 = scratch->_M_string_length;
              pcVar5 = "error in middle of record";
              goto LAB_00d3a063;
            }
          }
        }
        else {
          snprintf(local_68,0x28,"unknown record type %u",(ulong)uVar4);
          if (bVar2) {
            sVar7 = scratch->_M_string_length;
          }
          else {
            sVar7 = 0;
          }
          sVar7 = sVar7 + __len2;
          pcVar5 = local_68;
LAB_00d3a063:
          ReportCorruption(this,sVar7,pcVar5);
          scratch->_M_string_length = 0;
          *(scratch->_M_dataplus)._M_p = '\0';
          bVar2 = false;
          bVar6 = false;
        }
      }
    } while (!bVar6);
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool Reader::ReadRecord(Slice* record, std::string* scratch) {
  if (last_record_offset_ < initial_offset_) {
    if (!SkipToInitialBlock()) {
      return false;
    }
  }

  scratch->clear();
  record->clear();
  bool in_fragmented_record = false;
  // Record offset of the logical record that we're reading
  // 0 is a dummy value to make compilers happy
  uint64_t prospective_record_offset = 0;

  Slice fragment;
  while (true) {
    const unsigned int record_type = ReadPhysicalRecord(&fragment);

    // ReadPhysicalRecord may have only had an empty trailer remaining in its
    // internal buffer. Calculate the offset of the next physical record now
    // that it has returned, properly accounting for its header size.
    uint64_t physical_record_offset =
        end_of_buffer_offset_ - buffer_.size() - kHeaderSize - fragment.size();

    if (resyncing_) {
      if (record_type == kMiddleType) {
        continue;
      } else if (record_type == kLastType) {
        resyncing_ = false;
        continue;
      } else {
        resyncing_ = false;
      }
    }

    switch (record_type) {
      case kFullType:
        if (in_fragmented_record) {
          // Handle bug in earlier versions of log::Writer where
          // it could emit an empty kFirstType record at the tail end
          // of a block followed by a kFullType or kFirstType record
          // at the beginning of the next block.
          if (!scratch->empty()) {
            ReportCorruption(scratch->size(), "partial record without end(1)");
          }
        }
        prospective_record_offset = physical_record_offset;
        scratch->clear();
        *record = fragment;
        last_record_offset_ = prospective_record_offset;
        return true;

      case kFirstType:
        if (in_fragmented_record) {
          // Handle bug in earlier versions of log::Writer where
          // it could emit an empty kFirstType record at the tail end
          // of a block followed by a kFullType or kFirstType record
          // at the beginning of the next block.
          if (!scratch->empty()) {
            ReportCorruption(scratch->size(), "partial record without end(2)");
          }
        }
        prospective_record_offset = physical_record_offset;
        scratch->assign(fragment.data(), fragment.size());
        in_fragmented_record = true;
        break;

      case kMiddleType:
        if (!in_fragmented_record) {
          ReportCorruption(fragment.size(),
                           "missing start of fragmented record(1)");
        } else {
          scratch->append(fragment.data(), fragment.size());
        }
        break;

      case kLastType:
        if (!in_fragmented_record) {
          ReportCorruption(fragment.size(),
                           "missing start of fragmented record(2)");
        } else {
          scratch->append(fragment.data(), fragment.size());
          *record = Slice(*scratch);
          last_record_offset_ = prospective_record_offset;
          return true;
        }
        break;

      case kEof:
        if (in_fragmented_record) {
          // This can be caused by the writer dying immediately after
          // writing a physical record but before completing the next; don't
          // treat it as a corruption, just ignore the entire logical record.
          scratch->clear();
        }
        return false;

      case kBadRecord:
        if (in_fragmented_record) {
          ReportCorruption(scratch->size(), "error in middle of record");
          in_fragmented_record = false;
          scratch->clear();
        }
        break;

      default: {
        char buf[40];
        snprintf(buf, sizeof(buf), "unknown record type %u", record_type);
        ReportCorruption(
            (fragment.size() + (in_fragmented_record ? scratch->size() : 0)),
            buf);
        in_fragmented_record = false;
        scratch->clear();
        break;
      }
    }
  }
  return false;
}